

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::resize(raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this,size_t new_capacity)

{
  ctrl_t *p;
  size_t capacity;
  size_t hashval;
  size_t i;
  size_t sVar1;
  slot_type *arg;
  FindInfo FVar2;
  Layout LVar3;
  HashElement local_38;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    p = this->ctrl_;
    arg = this->slots_;
    capacity = this->capacity_;
    initialize_slots(this,new_capacity);
    this->capacity_ = new_capacity;
    for (sVar1 = 0; capacity != sVar1; sVar1 = sVar1 + 1) {
      if (-1 < p[sVar1]) {
        local_38.h = &(this->settings_).
                      super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .super__Head_base<1UL,_phmap::priv::StatefulTestingHash,_false>._M_head_impl;
        hashval = DecomposeValue<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::__cxx11::string>>::HashElement,std::__cxx11::string&>
                            (&local_38,arg);
        FVar2 = find_first_non_full(this,hashval);
        set_ctrl(this,FVar2.offset,(byte)hashval & 0x7f);
        FlatHashSetPolicy<std::__cxx11::string>::transfer<phmap::priv::Alloc<std::__cxx11::string>>
                  ((Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&this->settings_,this->slots_ + FVar2.offset,arg);
      }
      arg = arg + 1;
    }
    if (capacity != 0) {
      LVar3 = MakeLayout(capacity);
      Deallocate<8ul,phmap::priv::Alloc<std::__cxx11::string>>
                ((Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&this->settings_,p,
                 LVar3.
                 super_LayoutType<sizeof___(Ts),_signed_char,_std::__cxx11::basic_string<char>_>.
                 size_[1] * 0x20 +
                 (LVar3.
                  super_LayoutType<sizeof___(Ts),_signed_char,_std::__cxx11::basic_string<char>_>.
                  size_[0] + 7 & 0xfffffffffffffff8));
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x807,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string<char>>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::basic_string<char>>>::resize(size_t) [Policy = phmap::priv::FlatHashSetPolicy<std::basic_string<char>>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::basic_string<char>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }